

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralItem::~IfcStructuralItem(IfcStructuralItem *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcProduct.super_IfcObject.field_0x58 = 0x88f8c8;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x40 = 0x88f940;
  *(undefined8 *)&this[-1].super_IfcProduct.super_IfcObject.field_0xe0 = 0x88f8f0;
  this[-1].super_IfcProduct.Representation.ptr.obj = (LazyObject *)0x88f918;
  puVar1 = *(undefined1 **)&this[-1].super_IfcProduct.field_0x100;
  if (puVar1 != &this[-1].super_IfcProduct.field_0x110) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this[-1].super_IfcProduct.super_IfcObject.field_0x58 = 0x88f9e0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x40 = 0x88fa08;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcProduct.super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar1 != &this[-1].super_IfcProduct.super_IfcObject.field_0xc8) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcProduct.super_IfcObject.field_0x90;
  if ((bitset<1UL> *)puVar1 !=
      &this[-1].super_IfcProduct.super_IfcObject.
       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.aux_is_derived) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcProduct.super_IfcObject.field_0x68;
  if (puVar1 != &this[-1].super_IfcProduct.super_IfcObject.field_0x78) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcProduct.super_IfcObject.field_0x58);
  return;
}

Assistant:

IfcStructuralItem() : Object("IfcStructuralItem") {}